

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testValidCrop1(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetwork *this_00;
  NeuralNetworkLayer *this_01;
  CropLayerParams *this_02;
  ostream *poVar5;
  undefined1 local_b0 [8];
  Result res;
  BorderAmounts *amounts;
  CropLayerParams *params;
  NeuralNetworkLayer *cropLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(this,1);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"probs");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  this_00 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  this_01 = CoreML::Specification::NeuralNetwork::add_layers(this_00);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  this_02 = CoreML::Specification::NeuralNetworkLayer::mutable_crop(this_01);
  res.m_message.field_2._8_8_ = CoreML::Specification::CropLayerParams::mutable_cropamounts(this_02)
  ;
  CoreML::Specification::BorderAmounts::add_borderamounts
            ((BorderAmounts *)res.m_message.field_2._8_8_);
  CoreML::Specification::BorderAmounts::add_borderamounts
            ((BorderAmounts *)res.m_message.field_2._8_8_);
  CoreML::validate<(MLModelType)500>((Result *)local_b0,(Model *)&topIn);
  bVar1 = CoreML::Result::good((Result *)local_b0);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xe51);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,"(res).good()");
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  m1._oneof_case_[0]._0_1_ = !bVar1;
  CoreML::Result::~Result((Result *)local_b0);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testValidCrop1() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *cropLayer = nn->add_layers();
    cropLayer->add_input("input");
    cropLayer->add_output("probs");
    auto *params = cropLayer->mutable_crop();
    auto *amounts = params->mutable_cropamounts();
    (void)amounts->add_borderamounts();
    (void)amounts->add_borderamounts();

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    return 0;
}